

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [8];
  undefined1 auStackY_148 [128];
  CMFixtureFunction in_stack_ffffffffffffff38;
  CMFixtureFunction in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  CMUnitTest *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  
  memcpy(auStackY_148,&PTR_anon_var_dwarf_23_00182c90,0x140);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(mini_fuzz_array_container_intersection_inplace),
        cmocka_unit_test(
            mini_fuzz_recycle_array_container_intersection_inplace),
        cmocka_unit_test(printf_test),
        cmocka_unit_test(add_contains_test),
        cmocka_unit_test(and_or_test),
        cmocka_unit_test(to_uint32_array_test),
        cmocka_unit_test(select_test),
        cmocka_unit_test(capacity_test)};

    return cmocka_run_group_tests(tests, NULL, NULL);
}